

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O2

void UnitTest::
     ExecuteTest<(anonymous_namespace)::TestRunnerFixtureTestsThatAssertAreReportedAsFailingHelper>
               (TestRunnerFixtureTestsThatAssertAreReportedAsFailingHelper *testObject,
               TestDetails *details)

{
  TestList *this;
  TestResults *results;
  int iVar1;
  TestDetails **ppTVar2;
  TestResults **ppTVar3;
  undefined8 *puVar4;
  int local_4ec;
  TestDetails local_4e8;
  MockTest test;
  SignalTranslator sig;
  
  ppTVar2 = CurrentTest::Details();
  *ppTVar2 = details;
  SignalTranslator::SignalTranslator(&sig);
  iVar1 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar1 == 0) {
    anon_unknown.dwarf_3d6ae::MockTest::MockTest(&test,"test",true,true,1);
    this = &(testObject->super_TestRunnerFixture).list;
    TestList::Add(this,&test.super_Test);
    TestRunner::RunTestsIf<UnitTest::True>
              (&(testObject->super_TestRunnerFixture).runner,this,(char *)0x0,(True *)&local_4e8,0);
    ppTVar3 = CurrentTest::Results();
    results = *ppTVar3;
    local_4ec = 1;
    ppTVar2 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4e8,*ppTVar2,0x78);
    CheckEqual<int,int>(results,&local_4ec,
                        &(testObject->super_TestRunnerFixture).reporter.testFailedCount,&local_4e8);
    Test::~Test(&test.super_Test);
    SignalTranslator::~SignalTranslator(&sig);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "Unhandled system exception";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}